

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O0

ProcessGroupIndex * __thiscall
adios2::format::BPBase::ReadProcessGroupIndexHeader
          (BPBase *this,vector<char,_std::allocator<char>_> *buffer,size_t *position,
          bool isLittleEndian)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  size_t *in_RSI;
  ProcessGroupIndex *in_RDI;
  ProcessGroupIndex *index;
  size_t *in_stack_ffffffffffffff78;
  ProcessGroupIndex *buffer_00;
  string local_68 [31];
  undefined1 in_stack_ffffffffffffffb7;
  size_t *in_stack_ffffffffffffffb8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  BPBase *in_stack_ffffffffffffffc8;
  
  buffer_00 = in_RDI;
  ProcessGroupIndex::ProcessGroupIndex(in_RDI);
  uVar2 = helper::ReadValue<unsigned_short>
                    ((vector<char,_std::allocator<char>_> *)in_RDI,in_stack_ffffffffffffff78,false);
  buffer_00->Length = uVar2;
  ReadBPString_abi_cxx11_
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (bool)in_stack_ffffffffffffffb7);
  std::__cxx11::string::operator=((string *)&buffer_00->Name,(string *)&stack0xffffffffffffffb8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  cVar1 = helper::ReadValue<char>
                    ((vector<char,_std::allocator<char>_> *)in_RDI,in_stack_ffffffffffffff78,false);
  buffer_00->IsColumnMajor = cVar1;
  iVar3 = helper::ReadValue<int>
                    ((vector<char,_std::allocator<char>_> *)in_RDI,in_stack_ffffffffffffff78,false);
  buffer_00->ProcessID = iVar3;
  ReadBPString_abi_cxx11_
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             (bool)in_stack_ffffffffffffffb7);
  std::__cxx11::string::operator=((string *)&buffer_00->StepName,local_68);
  std::__cxx11::string::~string(local_68);
  uVar4 = helper::ReadValue<unsigned_int>
                    ((vector<char,_std::allocator<char>_> *)in_RDI,in_stack_ffffffffffffff78,false);
  buffer_00->Step = uVar4;
  uVar5 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)buffer_00,in_RSI,
                     SUB81((ulong)in_RDI >> 0x38,0));
  buffer_00->Offset = uVar5;
  return in_RDI;
}

Assistant:

BPBase::ProcessGroupIndex
BPBase::ReadProcessGroupIndexHeader(const std::vector<char> &buffer, size_t &position,
                                    const bool isLittleEndian) const noexcept
{
    ProcessGroupIndex index;
    index.Length = helper::ReadValue<uint16_t>(buffer, position, isLittleEndian);
    index.Name = ReadBPString(buffer, position, isLittleEndian);
    index.IsColumnMajor = helper::ReadValue<char>(buffer, position, isLittleEndian);
    index.ProcessID = helper::ReadValue<int32_t>(buffer, position, isLittleEndian);
    index.StepName = ReadBPString(buffer, position, isLittleEndian);
    index.Step = helper::ReadValue<uint32_t>(buffer, position, isLittleEndian);
    index.Offset = helper::ReadValue<uint64_t>(buffer, position, isLittleEndian);
    return index;
}